

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O3

string * __thiscall
rcdiscover::(anonymous_namespace)::extract_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint8_t *p,size_t len)

{
  _anonymous_namespace_ _Var1;
  string *psVar2;
  uint8_t *puVar3;
  bool bVar4;
  ostringstream out;
  _anonymous_namespace_ local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  _Var1 = *this;
  if (p != (uint8_t *)0x0 && _Var1 != (_anonymous_namespace_)0x0) {
    puVar3 = (uint8_t *)0x1;
    do {
      local_1a9 = _Var1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1a9,1);
      _Var1 = this[(long)puVar3];
      if (_Var1 == (_anonymous_namespace_)0x0) break;
      bVar4 = p != puVar3;
      puVar3 = puVar3 + 1;
    } while (bVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string extract(const uint8_t *p, size_t len)
{
  std::ostringstream out;

  while (*p != 0 && len > 0)
  {
    out << static_cast<char>(*p);

    p++;
    len--;
  }

  return out.str();
}